

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

int main(void)

{
  btree_kv_ops *kv_ops;
  long lVar1;
  btree_kv_ops **ops;
  btree_kv_ops *local_28 [3];
  
  local_28[0] = btree_kv_get_ku64_vu64();
  local_28[1] = btree_kv_get_ku32_vu64();
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    kv_init_ops_test((int)lVar1);
    kv_ops = local_28[lVar1];
    kv_init_var_test(kv_ops);
    kv_set_var_test(kv_ops);
    kv_set_var_nentry_test(kv_ops);
    kv_set_var_nentry_update_test(kv_ops);
    kv_get_var_test(kv_ops);
    kv_get_var_nentry_test(kv_ops);
    kv_ins_var(kv_ops);
    kv_ins_var_nentry_test(kv_ops);
    kv_set_str_key_test(kv_ops);
    kv_set_str_value_test(kv_ops);
    kv_get_str_data_size_test(kv_ops);
    kv_get_str_kv_size_test(kv_ops);
    kv_copy_var_test(kv_ops);
    kv_copy_var_nentry_test(kv_ops);
    kv_get_nth_idx_test(kv_ops);
    kv_get_nth_splitter_test(kv_ops);
    kv_cmp_key_str_test(kv_ops,(int)lVar1);
    kv_bid_to_value_to_bid_test(kv_ops);
  }
  return 0;
}

Assistant:

int main()
{
    int i;

    #ifdef _MEMPOOL
        mempool_init();
    #endif

    btree_kv_ops ** ops = alca(btree_kv_ops*, 2);
    ops[0] = btree_kv_get_ku64_vu64();
    ops[1] = btree_kv_get_ku32_vu64();

    for (i=0; i<2; i++){

        kv_init_ops_test(i);
        kv_init_var_test(ops[i]);

        kv_set_var_test(ops[i]);
        kv_set_var_nentry_test(ops[i]);
        kv_set_var_nentry_update_test(ops[i]);

        kv_get_var_test(ops[i]);
        kv_get_var_nentry_test(ops[i]);

        kv_ins_var(ops[i]);
        kv_ins_var_nentry_test(ops[i]);

        kv_set_str_key_test(ops[i]);
        kv_set_str_value_test(ops[i]);

        kv_get_str_data_size_test(ops[i]);
        kv_get_str_kv_size_test(ops[i]);

        kv_copy_var_test(ops[i]);
        kv_copy_var_nentry_test(ops[i]);

        kv_get_nth_idx_test(ops[i]);
        kv_get_nth_splitter_test(ops[i]);

        kv_cmp_key_str_test(ops[i], i);
        kv_bid_to_value_to_bid_test(ops[i]);
    }

    return 0;
}